

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void av1_highbd_dr_prediction_z2_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  undefined4 uVar7;
  int j_1;
  long lVar8;
  uint uVar9;
  undefined4 uVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int j;
  int iVar16;
  ulong uVar17;
  short sVar18;
  int iVar19;
  uint uVar20;
  undefined4 uVar21;
  uint uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 in_ZMM3 [64];
  ushort uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 (*local_70) [16];
  int y;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  
  auVar33._0_2_ = (undefined2)dy;
  bVar5 = (byte)upsample_above;
  local_70 = (undefined1 (*) [16])dst;
  if (bw == 8) {
    iVar6 = -1 << (bVar5 & 0x1f);
    iVar4 = -1 << ((byte)upsample_left & 0x1f);
    if (bd < 0xc) {
      auVar53._0_2_ = (undefined2)iVar4;
      auVar53._2_2_ = auVar53._0_2_;
      auVar53._4_2_ = auVar53._0_2_;
      auVar53._6_2_ = auVar53._0_2_;
      auVar53._8_2_ = auVar53._0_2_;
      auVar53._10_2_ = auVar53._0_2_;
      auVar53._12_2_ = auVar53._0_2_;
      auVar53._14_2_ = auVar53._0_2_;
      auVar30._2_2_ = auVar33._0_2_;
      auVar30._0_2_ = auVar33._0_2_;
      auVar30._4_2_ = auVar33._0_2_;
      auVar30._6_2_ = auVar33._0_2_;
      auVar30._8_2_ = auVar33._0_2_;
      auVar30._10_2_ = auVar33._0_2_;
      auVar30._12_2_ = auVar33._0_2_;
      auVar30._14_2_ = auVar33._0_2_;
      auVar30 = vpmullw_avx(auVar30,_DAT_00468c10);
      auVar33 = vpsrlw_avx(auVar30,1);
      auVar33 = vpand_avx(auVar33,_DAT_00468c20);
      if (bh < 1) {
        bh = 0;
      }
      uVar20 = -dx;
      auVar41._8_8_ = 0x1f001f001f001f;
      auVar41._0_8_ = 0x1f001f001f001f;
      auVar71._8_2_ = 0x10;
      auVar71._0_8_ = 0x10001000100010;
      auVar71._10_2_ = 0x10;
      auVar71._12_2_ = 0x10;
      auVar71._14_2_ = 0x10;
      auVar71._16_2_ = 0x10;
      auVar71._18_2_ = 0x10;
      auVar71._20_2_ = 0x10;
      auVar71._22_2_ = 0x10;
      auVar71._24_2_ = 0x10;
      auVar71._26_2_ = 0x10;
      auVar71._28_2_ = 0x10;
      auVar71._30_2_ = 0x10;
      sVar18 = 0;
      auVar100[8] = 0xf;
      auVar100._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar100[9] = 0xf;
      auVar100[10] = 0xf;
      auVar100[0xb] = 0xf;
      auVar100[0xc] = 0xf;
      auVar100[0xd] = 0xf;
      auVar100[0xe] = 0xf;
      auVar100[0xf] = 0xf;
      iVar4 = dx;
      while( true ) {
        bVar23 = bh == 0;
        bh = bh + -1;
        if (bVar23) break;
        uVar9 = (int)uVar20 >> (6 - bVar5 & 0x1f);
        uVar11 = (int)(~uVar9 + iVar6) >> (bVar5 & 0x1f);
        if (iVar6 + -1 <= (int)uVar9) {
          uVar11 = 0;
        }
        uVar22 = (int)((iVar6 + upsample_above) - uVar9) >> (bVar5 & 0x1f);
        if ((int)uVar22 < 1) {
          uVar22 = 0;
        }
        if (7 < (int)uVar22) {
          uVar22 = 8;
        }
        auVar72 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar90 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar81 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if ((int)uVar11 < 8) {
          lVar8 = (long)(int)uVar11;
          auVar88 = *(undefined1 (*) [16])(above + (int)uVar9 + lVar8);
          auVar66._0_2_ = (undefined2)iVar4;
          if (upsample_above == 0) {
            auVar88 = vpshufb_avx(auVar88,(undefined1  [16])HighbdLoadMaskx[lVar8]);
            auVar78 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar9 + lVar8 + 1),
                                  (undefined1  [16])HighbdLoadMaskx[lVar8]);
            auVar67._2_2_ = auVar66._0_2_;
            auVar67._0_2_ = auVar66._0_2_;
            auVar67._4_2_ = auVar66._0_2_;
            auVar67._6_2_ = auVar66._0_2_;
            auVar67._8_2_ = auVar66._0_2_;
            auVar67._10_2_ = auVar66._0_2_;
            auVar67._12_2_ = auVar66._0_2_;
            auVar67._14_2_ = auVar66._0_2_;
            auVar66 = vpsubw_avx(SUB6416(ZEXT864(0x1c0018001400100),0),auVar67);
            auVar68 = vpinsrw_avx(ZEXT416(uVar20),uVar20 + 0x40,1);
            auVar68 = vpinsrw_avx(auVar68,uVar20 + 0x80,2);
            auVar68 = vpinsrw_avx(auVar68,uVar20 + 0xc0,3);
            auVar68 = vpunpcklqdq_avx(auVar68,auVar66);
          }
          else {
            auVar78 = *(undefined1 (*) [16])HighbdEvenOddMaskx[lVar8];
            auVar68 = *(undefined1 (*) [16])(HighbdEvenOddMaskx[lVar8] + 0x10);
            auVar67 = vpshufb_avx(auVar88,auVar78);
            auVar98 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar9 + lVar8 + 8),
                                  auVar78);
            auVar27 = vpshufb_avx(auVar88,auVar68);
            auVar25 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar9 + lVar8 + 8),
                                  auVar68);
            auVar88 = vpcmpgtb_avx(auVar78,auVar100);
            auVar88 = vpblendvb_avx(auVar67,auVar98,auVar88);
            auVar78 = vpcmpgtb_avx(auVar68,auVar100);
            auVar78 = vpblendvb_avx(auVar27,auVar25,auVar78);
            auVar66._2_2_ = auVar66._0_2_;
            auVar66._4_2_ = auVar66._0_2_;
            auVar66._6_2_ = auVar66._0_2_;
            auVar66._8_2_ = auVar66._0_2_;
            auVar66._10_2_ = auVar66._0_2_;
            auVar66._12_2_ = auVar66._0_2_;
            auVar66._14_2_ = auVar66._0_2_;
            auVar66 = vpsubw_avx(SUB6416(ZEXT864(0x1c0018001400100),0),auVar66);
            auVar68 = vpinsrw_avx(ZEXT416(uVar20),uVar20 + 0x40,1);
            auVar68 = vpinsrw_avx(auVar68,uVar20 + 0x80,2);
            auVar68 = vpinsrw_avx(auVar68,uVar20 + 0xc0,3);
            auVar68 = vpunpcklqdq_avx(auVar68,auVar66);
            auVar68 = vpsllw_avx(auVar68,ZEXT416((uint)upsample_above));
          }
          auVar68 = vpsrlw_avx(auVar68,1);
          auVar68 = vpand_avx(auVar68,auVar41);
          auVar72._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar68;
          auVar72._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
          auVar81._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar88;
          auVar81._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
          auVar90._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar78;
          auVar90._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
        }
        auVar91 = auVar90;
        auVar73 = auVar72;
        auVar82 = auVar81;
        if ((int)uVar9 < iVar6) {
          auVar98._2_2_ = sVar18;
          auVar98._0_2_ = sVar18;
          auVar98._4_2_ = sVar18;
          auVar98._6_2_ = sVar18;
          auVar98._8_2_ = sVar18;
          auVar98._10_2_ = sVar18;
          auVar98._12_2_ = sVar18;
          auVar98._14_2_ = sVar18;
          auVar88 = vpaddw_avx(auVar98,auVar30);
          auVar78 = auVar33;
          if (upsample_left != 0) {
            auVar78 = vpsllw_avx(auVar88,ZEXT416((uint)upsample_left));
            auVar78 = vpsrlw_avx(auVar78,1);
            auVar78 = vpand_avx(auVar78,auVar41);
          }
          auVar68 = vpsraw_avx(auVar88,ZEXT416(6U - upsample_left));
          auVar88 = vpcmpgtw_avx(auVar53,auVar68);
          auVar88 = vpandn_avx(auVar88,auVar68);
          uVar12 = vpextrw_avx(auVar88,1);
          uVar7 = vpextrw_avx(auVar88,2);
          uVar10 = vpextrw_avx(auVar88,3);
          uVar13 = vpextrw_avx(auVar88,4);
          uVar21 = vpextrw_avx(auVar88,5);
          uVar15 = vpextrw_avx(auVar88,6);
          uVar14 = vpextrw_avx(auVar88,7);
          auVar68 = vpinsrw_avx(ZEXT216(left[auVar88._0_2_]),(uint)left[(short)uVar12],1);
          auVar68 = vpinsrw_avx(auVar68,(uint)left[(short)uVar7],2);
          auVar68 = vpinsrw_avx(auVar68,(uint)left[(short)uVar10],3);
          auVar68 = vpinsrw_avx(auVar68,(uint)left[(short)uVar13],4);
          auVar68 = vpinsrw_avx(auVar68,(uint)left[(short)uVar21],5);
          auVar68 = vpinsrw_avx(auVar68,(uint)left[(short)uVar15],6);
          auVar68 = vpinsrw_avx(auVar68,(uint)left[(short)uVar14],7);
          auVar88 = vpinsrw_avx(ZEXT216(left[(long)auVar88._0_2_ + 1]),
                                (uint)left[(long)(short)uVar12 + 1],1);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(long)(short)uVar7 + 1],2);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(long)(short)uVar10 + 1],3);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(long)(short)uVar13 + 1],4);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(long)(short)uVar21 + 1],5);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(long)(short)uVar15 + 1],6);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(long)(short)uVar14 + 1],7);
          auVar82._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar81._0_16_;
          auVar82._16_16_ = ZEXT116(0) * auVar81._16_16_ + ZEXT116(1) * auVar68;
          auVar91._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar90._0_16_;
          auVar91._16_16_ = ZEXT116(0) * auVar90._16_16_ + ZEXT116(1) * auVar88;
          auVar73._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar72._0_16_;
          auVar73._16_16_ = ZEXT116(0) * auVar72._16_16_ + ZEXT116(1) * auVar78;
        }
        auVar56 = vpsubw_avx2(auVar91,auVar82);
        auVar56 = vpmullw_avx2(auVar56,auVar73);
        auVar44 = vpsllw_avx2(auVar82,5);
        auVar56 = vpaddw_avx2(auVar56,auVar44);
        auVar56 = vpaddw_avx2(auVar56,auVar71);
        auVar56 = vpsrlw_avx2(auVar56,5);
        auVar88 = vpblendvb_avx(auVar56._0_16_,auVar56._16_16_,
                                *(undefined1 (*) [16])HighbdBaseMask[uVar22]);
        *local_70 = auVar88;
        sVar18 = sVar18 + 0x40;
        uVar20 = uVar20 - dx;
        iVar4 = iVar4 + dx;
        local_70 = (undefined1 (*) [16])(*local_70 + stride * 2);
      }
    }
    else {
      auVar44._4_4_ = iVar4;
      auVar44._0_4_ = iVar4;
      auVar44._8_4_ = iVar4;
      auVar44._12_4_ = iVar4;
      auVar44._16_4_ = iVar4;
      auVar44._20_4_ = iVar4;
      auVar44._24_4_ = iVar4;
      auVar44._28_4_ = iVar4;
      auVar56._4_4_ = dy;
      auVar56._0_4_ = dy;
      auVar56._8_4_ = dy;
      auVar56._12_4_ = dy;
      auVar56._16_4_ = dy;
      auVar56._20_4_ = dy;
      auVar56._24_4_ = dy;
      auVar56._28_4_ = dy;
      auVar71 = vpmulld_avx2(auVar56,_DAT_0046a160);
      auVar75._8_4_ = 0x1f;
      auVar75._0_8_ = 0x1f0000001f;
      auVar75._12_4_ = 0x1f;
      auVar75._16_4_ = 0x1f;
      auVar75._20_4_ = 0x1f;
      auVar75._24_4_ = 0x1f;
      auVar75._28_4_ = 0x1f;
      auVar56 = vpsrld_avx2(auVar71,1);
      auVar56 = vpand_avx2(auVar56,auVar75);
      if (bh < 1) {
        bh = 0;
      }
      uVar20 = -dx;
      auVar48._8_4_ = 0x10;
      auVar48._0_8_ = 0x1000000010;
      auVar48._12_4_ = 0x10;
      auVar48._16_4_ = 0x10;
      auVar48._20_4_ = 0x10;
      auVar48._24_4_ = 0x10;
      auVar48._28_4_ = 0x10;
      iVar19 = 0;
      iVar4 = dx;
      while( true ) {
        bVar23 = bh == 0;
        bh = bh + -1;
        if (bVar23) break;
        uVar9 = (int)uVar20 >> (6 - bVar5 & 0x1f);
        uVar11 = (int)(~uVar9 + iVar6) >> (bVar5 & 0x1f);
        if (iVar6 + -1 <= (int)uVar9) {
          uVar11 = 0;
        }
        uVar22 = (int)((iVar6 + upsample_above) - uVar9) >> (bVar5 & 0x1f);
        if ((int)uVar22 < 1) {
          uVar22 = 0;
        }
        if (7 < (int)uVar22) {
          uVar22 = 8;
        }
        auVar33 = (undefined1  [16])0x0;
        if ((int)uVar11 < 8) {
          lVar8 = (long)(int)uVar11;
          auVar33 = *(undefined1 (*) [16])(above + (int)uVar9 + lVar8);
          if (upsample_above == 0) {
            auVar33 = vpshufb_avx(auVar33,(undefined1  [16])HighbdLoadMaskx[lVar8]);
            auVar30 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar9 + lVar8 + 1),
                                  (undefined1  [16])HighbdLoadMaskx[lVar8]);
            auVar88._4_4_ = iVar4;
            auVar88._0_4_ = iVar4;
            auVar88._8_4_ = iVar4;
            auVar88._12_4_ = iVar4;
            iVar16 = uVar20 + 0x140;
            iVar1 = uVar20 + 0x180;
            iVar2 = uVar20 + 0x1c0;
            auVar53 = vpmovsxwd_avx(ZEXT816(0xc0008000400100));
            auVar53 = vpsubd_avx(auVar53,auVar88);
            auVar92 = vpermq_avx2(ZEXT1632(auVar53),0xc4);
            auVar92 = vpblendd_avx2(auVar92,ZEXT432(uVar20),1);
            auVar51._4_4_ = iVar16;
            auVar51._0_4_ = iVar16;
            auVar51._8_4_ = iVar16;
            auVar51._12_4_ = iVar16;
            auVar51._16_4_ = iVar16;
            auVar51._20_4_ = iVar16;
            auVar51._24_4_ = iVar16;
            auVar51._28_4_ = iVar16;
            auVar92 = vpblendd_avx2(auVar92,auVar51,0x20);
            auVar50._4_4_ = iVar1;
            auVar50._0_4_ = iVar1;
            auVar50._8_4_ = iVar1;
            auVar50._12_4_ = iVar1;
            auVar50._16_4_ = iVar1;
            auVar50._20_4_ = iVar1;
            auVar50._24_4_ = iVar1;
            auVar50._28_4_ = iVar1;
            auVar92 = vpblendd_avx2(auVar92,auVar50,0x40);
            auVar64._4_4_ = iVar2;
            auVar64._0_4_ = iVar2;
            auVar64._8_4_ = iVar2;
            auVar64._12_4_ = iVar2;
            auVar64._16_4_ = iVar2;
            auVar64._20_4_ = iVar2;
            auVar64._24_4_ = iVar2;
            auVar64._28_4_ = iVar2;
            auVar92 = vpblendd_avx2(auVar92,auVar64,0x80);
          }
          else {
            auVar30 = *(undefined1 (*) [16])HighbdEvenOddMaskx[lVar8];
            auVar53 = *(undefined1 (*) [16])(HighbdEvenOddMaskx[lVar8] + 0x10);
            auVar88 = vpshufb_avx(auVar33,auVar30);
            auVar78 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar9 + lVar8 + 8),
                                  auVar30);
            auVar68[8] = 0xf;
            auVar68._0_8_ = 0xf0f0f0f0f0f0f0f;
            auVar68[9] = 0xf;
            auVar68[10] = 0xf;
            auVar68[0xb] = 0xf;
            auVar68[0xc] = 0xf;
            auVar68[0xd] = 0xf;
            auVar68[0xe] = 0xf;
            auVar68[0xf] = 0xf;
            auVar41 = vpshufb_avx(auVar33,auVar53);
            auVar33 = vpcmpgtb_avx(auVar30,auVar68);
            auVar33 = vpblendvb_avx(auVar88,auVar78,auVar33);
            auVar88 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar9 + lVar8 + 8),
                                  auVar53);
            auVar30 = vpcmpgtb_avx(auVar53,auVar68);
            auVar30 = vpblendvb_avx(auVar41,auVar88,auVar30);
            auVar78._4_4_ = iVar4;
            auVar78._0_4_ = iVar4;
            auVar78._8_4_ = iVar4;
            auVar78._12_4_ = iVar4;
            iVar16 = uVar20 + 0x140;
            iVar1 = uVar20 + 0x180;
            iVar2 = uVar20 + 0x1c0;
            auVar53 = vpmovsxwd_avx(ZEXT816(0xc0008000400100));
            auVar53 = vpsubd_avx(auVar53,auVar78);
            auVar92 = vpermq_avx2(ZEXT1632(auVar53),0xc4);
            auVar92 = vpblendd_avx2(auVar92,ZEXT432(uVar20),1);
            auVar61._4_4_ = iVar16;
            auVar61._0_4_ = iVar16;
            auVar61._8_4_ = iVar16;
            auVar61._12_4_ = iVar16;
            auVar61._16_4_ = iVar16;
            auVar61._20_4_ = iVar16;
            auVar61._24_4_ = iVar16;
            auVar61._28_4_ = iVar16;
            auVar92 = vpblendd_avx2(auVar92,auVar61,0x20);
            auVar62._4_4_ = iVar1;
            auVar62._0_4_ = iVar1;
            auVar62._8_4_ = iVar1;
            auVar62._12_4_ = iVar1;
            auVar62._16_4_ = iVar1;
            auVar62._20_4_ = iVar1;
            auVar62._24_4_ = iVar1;
            auVar62._28_4_ = iVar1;
            auVar92 = vpblendd_avx2(auVar92,auVar62,0x40);
            auVar63._4_4_ = iVar2;
            auVar63._0_4_ = iVar2;
            auVar63._8_4_ = iVar2;
            auVar63._12_4_ = iVar2;
            auVar63._16_4_ = iVar2;
            auVar63._20_4_ = iVar2;
            auVar63._24_4_ = iVar2;
            auVar63._28_4_ = iVar2;
            auVar92 = vpblendd_avx2(auVar92,auVar63,0x80);
            auVar92 = vpslld_avx2(auVar92,ZEXT416((uint)upsample_above));
          }
          auVar50 = vpsrld_avx2(auVar92,1);
          auVar92 = vpmovzxwd_avx2(auVar33);
          auVar51 = vpmovzxwd_avx2(auVar30);
          auVar51 = vpsubd_avx2(auVar51,auVar92);
          auVar64 = vpslld_avx2(auVar92,5);
          auVar92 = vpand_avx2(auVar50,auVar75);
          auVar51 = vpmulld_avx2(auVar51,auVar92);
          auVar92 = vpaddd_avx2(auVar64,auVar48);
          auVar92 = vpaddd_avx2(auVar51,auVar92);
          auVar92 = vpsrld_avx2(auVar92,5);
          auVar33 = vpackusdw_avx(auVar92._0_16_,auVar92._16_16_);
        }
        auVar30 = auVar33;
        if ((int)uVar9 < iVar6) {
          auVar92._4_4_ = iVar19;
          auVar92._0_4_ = iVar19;
          auVar92._8_4_ = iVar19;
          auVar92._12_4_ = iVar19;
          auVar92._16_4_ = iVar19;
          auVar92._20_4_ = iVar19;
          auVar92._24_4_ = iVar19;
          auVar92._28_4_ = iVar19;
          auVar92 = vpaddd_avx2(auVar92,auVar71);
          auVar51 = auVar56;
          if (upsample_left != 0) {
            auVar51 = vpslld_avx2(auVar92,ZEXT416((uint)upsample_left));
            auVar51 = vpsrld_avx2(auVar51,1);
            auVar51 = vpand_avx2(auVar51,auVar75);
          }
          auVar50 = vpsrad_avx2(auVar92,ZEXT416(6U - upsample_left));
          auVar92 = vpcmpgtd_avx2(auVar44,auVar50);
          auVar92 = vpandn_avx2(auVar92,auVar50);
          auVar30 = vpinsrw_avx(ZEXT216(left[auVar92._0_4_]),(uint)left[auVar92._4_4_],1);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._8_4_],2);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._12_4_],3);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._16_4_],4);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._20_4_],5);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._24_4_],6);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._28_4_],7);
          auVar53 = vpinsrw_avx(ZEXT216(left[(long)auVar92._0_4_ + 1]),
                                (uint)left[(long)auVar92._4_4_ + 1],1);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._8_4_ + 1],2);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._12_4_ + 1],3);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._16_4_ + 1],4);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._20_4_ + 1],5);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._24_4_ + 1],6);
          auVar50 = vpmovzxwd_avx2(auVar30);
          auVar30 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._28_4_ + 1],7);
          auVar92 = vpmovzxwd_avx2(auVar30);
          auVar92 = vpsubd_avx2(auVar92,auVar50);
          auVar51 = vpmulld_avx2(auVar51,auVar92);
          auVar92 = vpslld_avx2(auVar50,5);
          auVar92 = vpaddd_avx2(auVar92,auVar48);
          auVar92 = vpaddd_avx2(auVar51,auVar92);
          auVar92 = vpsrld_avx2(auVar92,5);
          auVar30 = vpackusdw_avx(auVar92._0_16_,auVar92._16_16_);
        }
        auVar33 = vpblendvb_avx(auVar33,auVar30,*(undefined1 (*) [16])HighbdBaseMask[uVar22]);
        *local_70 = auVar33;
        iVar19 = iVar19 + 0x40;
        uVar20 = uVar20 - dx;
        iVar4 = iVar4 + dx;
        local_70 = (undefined1 (*) [16])(*local_70 + stride * 2);
      }
    }
  }
  else if (bw == 4) {
    iVar6 = -1 << (bVar5 & 0x1f);
    iVar4 = -1 << ((byte)upsample_left & 0x1f);
    if (bd < 0xc) {
      auVar24._0_2_ = (undefined2)iVar4;
      auVar24._2_2_ = auVar24._0_2_;
      auVar24._4_2_ = auVar24._0_2_;
      auVar24._6_2_ = auVar24._0_2_;
      auVar24._8_2_ = auVar24._0_2_;
      auVar24._10_2_ = auVar24._0_2_;
      auVar24._12_2_ = auVar24._0_2_;
      auVar24._14_2_ = auVar24._0_2_;
      auVar33._2_2_ = auVar33._0_2_;
      auVar33._4_2_ = auVar33._0_2_;
      auVar33._6_2_ = auVar33._0_2_;
      auVar33._8_2_ = auVar33._0_2_;
      auVar33._10_2_ = auVar33._0_2_;
      auVar33._12_2_ = auVar33._0_2_;
      auVar33._14_2_ = auVar33._0_2_;
      auVar30 = vpmullw_avx(auVar33,_DAT_00468c40);
      auVar33 = vpsrlw_avx(auVar30,1);
      auVar33 = vpand_avx(auVar33,_DAT_00468c20);
      if (bh < 1) {
        bh = 0;
      }
      uVar20 = -dx;
      auVar40._8_8_ = 0x1f001f001f001f;
      auVar40._0_8_ = 0x1f001f001f001f;
      auVar45._8_2_ = 0x10;
      auVar45._0_8_ = 0x10001000100010;
      auVar45._10_2_ = 0x10;
      auVar45._12_2_ = 0x10;
      auVar45._14_2_ = 0x10;
      auVar45._16_2_ = 0x10;
      auVar45._18_2_ = 0x10;
      auVar45._20_2_ = 0x10;
      auVar45._22_2_ = 0x10;
      auVar45._24_2_ = 0x10;
      auVar45._26_2_ = 0x10;
      auVar45._28_2_ = 0x10;
      auVar45._30_2_ = 0x10;
      sVar18 = 0;
      while( true ) {
        bVar23 = bh == 0;
        bh = bh + -1;
        if (bVar23) break;
        uVar9 = (int)uVar20 >> (6 - bVar5 & 0x1f);
        uVar11 = (int)(~uVar9 + iVar6) >> (bVar5 & 0x1f);
        if (iVar6 + -1 <= (int)uVar9) {
          uVar11 = 0;
        }
        uVar22 = (int)((iVar6 + upsample_above) - uVar9) >> (bVar5 & 0x1f);
        if ((int)uVar22 < 1) {
          uVar22 = 0;
        }
        if (3 < (int)uVar22) {
          uVar22 = 4;
        }
        auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar79 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar69 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if ((int)uVar11 < 4) {
          auVar53 = vpinsrw_avx(ZEXT416(uVar20 & 0xffff),uVar20 + 0x40,1);
          auVar53 = vpinsrw_avx(auVar53,uVar20 + 0x80,2);
          auVar53 = vpinsrw_avx(auVar53,uVar20 + 0xc0,3);
          if (upsample_above == 0) {
            auVar88 = vpshufb_avx(*(undefined1 (*) [16])
                                   (above + (long)(int)uVar9 + (long)(int)uVar11),
                                  (undefined1  [16])HighbdLoadMaskx[(int)uVar11]);
            auVar78 = vpsrldq_avx(auVar88,2);
          }
          else {
            auVar88 = vpshufb_avx(*(undefined1 (*) [16])
                                   (above + (long)(int)uVar9 + (long)(int)uVar11),
                                  (undefined1  [16])HighbdEvenOddMaskx4[(int)uVar11]);
            auVar78 = vpsrldq_avx(auVar88,8);
            auVar53 = vpsllw_avx(auVar53,ZEXT416((uint)upsample_above));
          }
          auVar53 = vpsrlw_avx(auVar53,1);
          auVar53 = vpand_avx(auVar53,auVar40);
          auVar54._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar53;
          auVar54._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
          auVar69._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar88;
          auVar69._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
          auVar79._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar78;
          auVar79._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
        }
        auVar80 = auVar79;
        auVar55 = auVar54;
        auVar70 = auVar69;
        if ((int)uVar9 < iVar6) {
          auVar87._2_2_ = sVar18;
          auVar87._0_2_ = sVar18;
          auVar87._4_2_ = sVar18;
          auVar87._6_2_ = sVar18;
          auVar87._8_2_ = sVar18;
          auVar87._10_2_ = sVar18;
          auVar87._12_2_ = sVar18;
          auVar87._14_2_ = sVar18;
          auVar53 = vpaddw_avx(auVar87,auVar30);
          auVar88 = auVar33;
          if (upsample_left != 0) {
            auVar88 = vpsllw_avx(auVar53,ZEXT416((uint)upsample_left));
            auVar88 = vpsrlw_avx(auVar88,1);
            auVar88 = vpand_avx(auVar88,auVar40);
          }
          auVar78 = vpsraw_avx(auVar53,ZEXT416(6U - upsample_left));
          auVar53 = vpcmpgtw_avx(auVar24,auVar78);
          auVar53 = vpandn_avx(auVar53,auVar78);
          uVar10 = vpextrw_avx(auVar53,1);
          uVar12 = vpextrw_avx(auVar53,2);
          uVar7 = vpextrw_avx(auVar53,3);
          auVar78 = vpinsrw_avx(ZEXT216(left[auVar53._0_2_]),(uint)left[(short)uVar10],1);
          auVar78 = vpinsrw_avx(auVar78,(uint)left[(short)uVar12],2);
          auVar78 = vpinsrw_avx(auVar78,(uint)left[(short)uVar7],3);
          auVar53 = vpinsrw_avx(ZEXT216(left[(long)auVar53._0_2_ + 1]),
                                (uint)left[(long)(short)uVar10 + 1],1);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)(short)uVar12 + 1],2);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)(short)uVar7 + 1],3);
          auVar70._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar69._0_16_;
          auVar70._16_16_ = ZEXT116(0) * auVar69._16_16_ + ZEXT116(1) * auVar78;
          auVar80._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar79._0_16_;
          auVar80._16_16_ = ZEXT116(0) * auVar79._16_16_ + ZEXT116(1) * auVar53;
          auVar55._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar54._0_16_;
          auVar55._16_16_ = ZEXT116(0) * auVar54._16_16_ + ZEXT116(1) * auVar88;
        }
        auVar56 = vpsubw_avx2(auVar80,auVar70);
        auVar56 = vpmullw_avx2(auVar56,auVar55);
        auVar71 = vpsllw_avx2(auVar70,5);
        auVar56 = vpaddw_avx2(auVar71,auVar56);
        auVar56 = vpaddw_avx2(auVar56,auVar45);
        auVar56 = vpsrlw_avx2(auVar56,5);
        auVar53 = vpblendvb_avx(auVar56._0_16_,auVar56._16_16_,
                                *(undefined1 (*) [16])HighbdBaseMask[uVar22]);
        *(long *)local_70 = auVar53._0_8_;
        sVar18 = sVar18 + 0x40;
        uVar20 = uVar20 - dx;
        local_70 = (undefined1 (*) [16])((long)local_70 + stride * 2);
      }
    }
    else {
      auVar26._4_4_ = iVar4;
      auVar26._0_4_ = iVar4;
      auVar26._8_4_ = iVar4;
      auVar26._12_4_ = iVar4;
      auVar31._4_4_ = dy;
      auVar31._0_4_ = dy;
      auVar31._8_4_ = dy;
      auVar31._12_4_ = dy;
      auVar30 = vpmulld_avx(auVar31,_DAT_0046a290);
      auVar34._8_4_ = 0x1f;
      auVar34._0_8_ = 0x1f0000001f;
      auVar34._12_4_ = 0x1f;
      auVar33 = vpsrld_avx(auVar30,1);
      auVar33 = vpand_avx(auVar33,auVar34);
      if (bh < 1) {
        bh = 0;
      }
      uVar20 = -dx;
      auVar42._8_8_ = 0x1f0000001f;
      auVar42._0_8_ = 0x1f0000001f;
      auVar49._8_4_ = 0x10;
      auVar49._0_8_ = 0x1000000010;
      auVar49._12_4_ = 0x10;
      auVar49._16_4_ = 0x10;
      auVar49._20_4_ = 0x10;
      auVar49._24_4_ = 0x10;
      auVar49._28_4_ = 0x10;
      iVar4 = 0;
      while (bVar23 = bh != 0, bh = bh + -1, bVar23) {
        uVar11 = (int)uVar20 >> (6 - bVar5 & 0x1f);
        iVar19 = (int)(~uVar11 + iVar6) >> (bVar5 & 0x1f);
        if (iVar6 + -1 <= (int)uVar11) {
          iVar19 = 0;
        }
        uVar9 = (int)((iVar6 + upsample_above) - uVar11) >> (bVar5 & 0x1f);
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if (3 < (int)uVar9) {
          uVar9 = 4;
        }
        auVar59 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar71 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar56 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if (iVar19 < 4) {
          auVar53 = vpinsrd_avx(ZEXT416(uVar20),uVar20 + 0x40,1);
          auVar53 = vpinsrd_avx(auVar53,uVar20 + 0x80,2);
          auVar53 = vpinsrd_avx(auVar53,uVar20 + 0xc0,3);
          if (upsample_above == 0) {
            auVar88 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar11 + (long)iVar19),
                                  (undefined1  [16])HighbdLoadMaskx[iVar19]);
            auVar78 = vpsrldq_avx(auVar88,2);
          }
          else {
            auVar88 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar11 + (long)iVar19),
                                  (undefined1  [16])HighbdEvenOddMaskx4[iVar19]);
            auVar78 = vpsrldq_avx(auVar88,8);
            auVar53 = vpslld_avx(auVar53,ZEXT416((uint)upsample_above));
          }
          auVar53 = vpsrld_avx(auVar53,1);
          auVar53 = vpand_avx(auVar53,auVar42);
          auVar59._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar53;
          auVar59._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
          auVar56 = vpmovzxwd_avx2(auVar88);
          auVar71 = vpmovzxwd_avx2(auVar78);
        }
        auVar86 = auVar71;
        auVar60 = auVar59;
        auVar76 = auVar56;
        if ((int)uVar11 < iVar6) {
          auVar89._4_4_ = iVar4;
          auVar89._0_4_ = iVar4;
          auVar89._8_4_ = iVar4;
          auVar89._12_4_ = iVar4;
          auVar53 = vpaddd_avx(auVar89,auVar30);
          auVar88 = auVar33;
          if (upsample_left != 0) {
            auVar88 = vpslld_avx(auVar53,ZEXT416((uint)upsample_left));
            auVar88 = vpsrld_avx(auVar88,1);
            auVar88 = vpand_avx(auVar88,auVar42);
          }
          auVar78 = vpsrad_avx(auVar53,ZEXT416(6U - upsample_left));
          auVar53 = vpcmpgtd_avx(auVar26,auVar78);
          auVar53 = vpandn_avx(auVar53,auVar78);
          auVar78 = vpinsrd_avx(ZEXT216(left[auVar53._0_4_]),(uint)left[auVar53._4_4_],1);
          auVar78 = vpinsrd_avx(auVar78,(uint)left[auVar53._8_4_],2);
          auVar78 = vpinsrd_avx(auVar78,(uint)left[auVar53._12_4_],3);
          auVar41 = vpinsrd_avx(ZEXT216(left[(long)auVar53._0_4_ + 1]),
                                (uint)left[(long)auVar53._4_4_ + 1],1);
          auVar41 = vpinsrd_avx(auVar41,(uint)left[(long)auVar53._8_4_ + 1],2);
          auVar53 = vpinsrd_avx(auVar41,(uint)left[(long)auVar53._12_4_ + 1],3);
          auVar76._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar56._0_16_;
          auVar76._16_16_ = ZEXT116(0) * auVar56._16_16_ + ZEXT116(1) * auVar78;
          auVar86._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar71._0_16_;
          auVar86._16_16_ = ZEXT116(0) * auVar71._16_16_ + ZEXT116(1) * auVar53;
          auVar60._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar59._0_16_;
          auVar60._16_16_ = ZEXT116(0) * auVar59._16_16_ + ZEXT116(1) * auVar88;
        }
        auVar56 = vpsubd_avx2(auVar86,auVar76);
        auVar56 = vpmulld_avx2(auVar56,auVar60);
        auVar71 = vpslld_avx2(auVar76,5);
        auVar56 = vpaddd_avx2(auVar71,auVar56);
        auVar56 = vpaddd_avx2(auVar56,auVar49);
        auVar56 = vpsrld_avx2(auVar56,5);
        auVar53 = vpackusdw_avx(auVar56._0_16_,auVar56._0_16_);
        auVar88 = vpackusdw_avx(auVar56._16_16_,auVar56._16_16_);
        auVar53 = vpblendvb_avx(auVar53,auVar88,*(undefined1 (*) [16])HighbdBaseMask[uVar9]);
        *(long *)local_70 = auVar53._0_8_;
        iVar4 = iVar4 + 0x40;
        uVar20 = uVar20 - dx;
        local_70 = (undefined1 (*) [16])((long)local_70 + stride * 2);
      }
    }
  }
  else if (bd < 0xc) {
    auVar25._2_2_ = auVar33._0_2_;
    auVar25._0_2_ = auVar33._0_2_;
    auVar25._4_2_ = auVar33._0_2_;
    auVar25._6_2_ = auVar33._0_2_;
    auVar25._8_2_ = auVar33._0_2_;
    auVar25._10_2_ = auVar33._0_2_;
    auVar25._12_2_ = auVar33._0_2_;
    auVar25._14_2_ = auVar33._0_2_;
    auVar28._16_2_ = auVar33._0_2_;
    auVar28._0_16_ = auVar25;
    auVar28._18_2_ = auVar33._0_2_;
    auVar28._20_2_ = auVar33._0_2_;
    auVar28._22_2_ = auVar33._0_2_;
    auVar28._24_2_ = auVar33._0_2_;
    auVar28._26_2_ = auVar33._0_2_;
    auVar28._28_2_ = auVar33._0_2_;
    auVar28._30_2_ = auVar33._0_2_;
    if (bh < 1) {
      bh = 0;
    }
    iVar6 = -dx;
    auVar32._8_2_ = 0x10;
    auVar32._0_8_ = 0x10001000100010;
    auVar32._10_2_ = 0x10;
    auVar32._12_2_ = 0x10;
    auVar32._14_2_ = 0x10;
    auVar32._16_2_ = 0x10;
    auVar32._18_2_ = 0x10;
    auVar32._20_2_ = 0x10;
    auVar32._22_2_ = 0x10;
    auVar32._24_2_ = 0x10;
    auVar32._26_2_ = 0x10;
    auVar32._28_2_ = 0x10;
    auVar32._30_2_ = 0x10;
    auVar71 = vpmovsxbw_avx2(_DAT_0046a2a0);
    auVar56 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    iVar4 = 0;
    while (iVar4 != bh) {
      uVar3 = (ushort)((uint)-((iVar4 + 1) * dx) >> 1);
      uVar37 = uVar3 & 0x1f;
      auVar38._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
      auVar38._8_2_ = uVar37;
      auVar38._10_2_ = uVar37;
      auVar38._12_2_ = uVar37;
      auVar38._14_2_ = uVar37;
      auVar38._16_2_ = uVar37;
      auVar38._18_2_ = uVar37;
      auVar38._20_2_ = uVar37;
      auVar38._22_2_ = uVar37;
      auVar38._24_2_ = uVar37;
      auVar38._26_2_ = uVar37;
      auVar38._28_2_ = uVar37;
      auVar38._30_2_ = uVar37;
      auVar43._0_2_ = (undefined2)iVar4;
      auVar43._2_2_ = auVar43._0_2_;
      auVar43._4_2_ = auVar43._0_2_;
      auVar43._6_2_ = auVar43._0_2_;
      auVar43._8_2_ = auVar43._0_2_;
      auVar43._10_2_ = auVar43._0_2_;
      auVar43._12_2_ = auVar43._0_2_;
      auVar43._14_2_ = auVar43._0_2_;
      auVar43._16_2_ = auVar43._0_2_;
      auVar43._18_2_ = auVar43._0_2_;
      auVar43._20_2_ = auVar43._0_2_;
      auVar43._22_2_ = auVar43._0_2_;
      auVar43._24_2_ = auVar43._0_2_;
      auVar43._26_2_ = auVar43._0_2_;
      auVar43._28_2_ = auVar43._0_2_;
      auVar43._30_2_ = auVar43._0_2_;
      auVar44 = vpsllw_avx2(auVar43,6);
      iVar19 = iVar6;
      for (lVar8 = 0; lVar8 < bw; lVar8 = lVar8 + 0x10) {
        uVar20 = iVar19 >> 6;
        uVar17 = (ulong)-(uVar20 + 2);
        if (-3 < (int)uVar20) {
          uVar17 = 0;
        }
        uVar11 = 0xffffffff;
        if ((int)uVar20 < -1) {
          uVar11 = uVar20;
        }
        uVar11 = ~uVar11;
        if ((int)uVar20 < -0x11) {
          uVar11 = 0x10;
        }
        auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar57 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        iVar16 = (int)uVar17;
        if (iVar16 < 8) {
          auVar33 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar20 + uVar17),
                                (undefined1  [16])HighbdLoadMaskx[uVar17]);
          auVar30 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar20 + uVar17 + 1),
                                (undefined1  [16])HighbdLoadMaskx[uVar17]);
          auVar57._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar33;
          auVar57._16_16_ = ZEXT116(1) * auVar25;
          auVar46._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar30;
          auVar46._16_16_ = ZEXT116(1) * auVar25;
        }
        uVar9 = iVar16 - 8;
        if (iVar16 < 9) {
          uVar9 = 0;
        }
        auVar47 = auVar46;
        auVar58 = auVar57;
        if ((int)uVar9 < 8) {
          uVar17 = (ulong)uVar9;
          auVar33 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar20 + uVar17 + 8),
                                (undefined1  [16])HighbdLoadMaskx[uVar17]);
          auVar30 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar20 + uVar17 + 9),
                                (undefined1  [16])HighbdLoadMaskx[uVar17]);
          auVar58._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar57._0_16_;
          auVar58._16_16_ = ZEXT116(0) * auVar57._16_16_ + ZEXT116(1) * auVar33;
          auVar47._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar46._0_16_;
          auVar47._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar30;
        }
        auVar75 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if ((int)uVar20 < -1) {
          auVar74._0_2_ = (undefined2)lVar8;
          auVar74._2_2_ = auVar74._0_2_;
          auVar74._4_2_ = auVar74._0_2_;
          auVar74._6_2_ = auVar74._0_2_;
          auVar74._8_2_ = auVar74._0_2_;
          auVar74._10_2_ = auVar74._0_2_;
          auVar74._12_2_ = auVar74._0_2_;
          auVar74._14_2_ = auVar74._0_2_;
          auVar74._16_2_ = auVar74._0_2_;
          auVar74._18_2_ = auVar74._0_2_;
          auVar74._20_2_ = auVar74._0_2_;
          auVar74._22_2_ = auVar74._0_2_;
          auVar74._24_2_ = auVar74._0_2_;
          auVar74._26_2_ = auVar74._0_2_;
          auVar74._28_2_ = auVar74._0_2_;
          auVar74._30_2_ = auVar74._0_2_;
          auVar75 = vpaddw_avx2(auVar74,auVar71);
          auVar75 = vpmullw_avx2(auVar75,auVar28);
          auVar83._8_2_ = 0x7fff;
          auVar83._0_8_ = 0x7fff7fff7fff7fff;
          auVar83._10_2_ = 0x7fff;
          auVar83._12_2_ = 0x7fff;
          auVar83._14_2_ = 0x7fff;
          auVar83._16_2_ = 0x7fff;
          auVar83._18_2_ = 0x7fff;
          auVar83._20_2_ = 0x7fff;
          auVar83._22_2_ = 0x7fff;
          auVar83._24_2_ = 0x7fff;
          auVar83._26_2_ = 0x7fff;
          auVar83._28_2_ = 0x7fff;
          auVar83._30_2_ = 0x7fff;
          auVar75 = vpminuw_avx2(auVar75,auVar83);
          auVar48 = vpsubw_avx2(auVar44,auVar75);
          auVar84._8_2_ = 0xfffe;
          auVar84._0_8_ = 0xfffefffefffefffe;
          auVar84._10_2_ = 0xfffe;
          auVar84._12_2_ = 0xfffe;
          auVar84._14_2_ = 0xfffe;
          auVar84._16_2_ = 0xfffe;
          auVar84._18_2_ = 0xfffe;
          auVar84._20_2_ = 0xfffe;
          auVar84._22_2_ = 0xfffe;
          auVar84._24_2_ = 0xfffe;
          auVar84._26_2_ = 0xfffe;
          auVar84._28_2_ = 0xfffe;
          auVar84._30_2_ = 0xfffe;
          auVar92 = vpsraw_avx2(auVar48,6);
          auVar75 = vpcmpgtw_avx2(auVar92,auVar84);
          auVar75 = vpand_avx2(auVar75,auVar92);
          auVar53 = auVar75._0_16_;
          auVar30 = auVar75._16_16_;
          uVar7 = vpextrw_avx(auVar30,1);
          uVar10 = vpextrw_avx(auVar30,2);
          auVar33 = vpinsrw_avx(ZEXT216(left[auVar75._16_2_]),(uint)left[(short)uVar7],1);
          uVar7 = vpextrw_avx(auVar30,3);
          auVar33 = vpinsrw_avx(auVar33,(uint)left[(short)uVar10],2);
          uVar10 = vpextrw_avx(auVar30,4);
          auVar33 = vpinsrw_avx(auVar33,(uint)left[(short)uVar7],3);
          uVar7 = vpextrw_avx(auVar30,5);
          auVar33 = vpinsrw_avx(auVar33,(uint)left[(short)uVar10],4);
          uVar10 = vpextrw_avx(auVar30,6);
          auVar33 = vpinsrw_avx(auVar33,(uint)left[(short)uVar7],5);
          uVar7 = vpextrw_avx(auVar30,7);
          auVar33 = vpinsrw_avx(auVar33,(uint)left[(short)uVar10],6);
          auVar33 = vpinsrw_avx(auVar33,(uint)left[(short)uVar7],7);
          uVar10 = vpextrw_avx(auVar53,1);
          uVar7 = vpextrw_avx(auVar53,2);
          auVar30 = vpinsrw_avx(ZEXT216(left[auVar75._0_2_]),(uint)left[(short)uVar10],1);
          uVar10 = vpextrw_avx(auVar53,3);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[(short)uVar7],2);
          uVar7 = vpextrw_avx(auVar53,4);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[(short)uVar10],3);
          uVar10 = vpextrw_avx(auVar53,5);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[(short)uVar7],4);
          uVar7 = vpextrw_avx(auVar53,6);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[(short)uVar10],5);
          uVar10 = vpextrw_avx(auVar53,7);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[(short)uVar7],6);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[(short)uVar10],7);
          auVar75 = vpsubw_avx2(auVar75,auVar56);
          auVar78 = auVar75._0_16_;
          auVar88 = auVar75._16_16_;
          uVar7 = vpextrw_avx(auVar88,1);
          uVar10 = vpextrw_avx(auVar88,2);
          auVar53 = vpinsrw_avx(ZEXT216(left[auVar75._16_2_]),(uint)left[(short)uVar7],1);
          uVar7 = vpextrw_avx(auVar88,3);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(short)uVar10],2);
          uVar10 = vpextrw_avx(auVar88,4);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(short)uVar7],3);
          uVar7 = vpextrw_avx(auVar88,5);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(short)uVar10],4);
          uVar10 = vpextrw_avx(auVar88,6);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(short)uVar7],5);
          uVar7 = vpextrw_avx(auVar88,7);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(short)uVar10],6);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(short)uVar7],7);
          uVar7 = vpextrw_avx(auVar78,1);
          auVar88 = vpinsrw_avx(ZEXT216(left[auVar75._0_2_]),(uint)left[(short)uVar7],1);
          uVar7 = vpextrw_avx(auVar78,2);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(short)uVar7],2);
          uVar7 = vpextrw_avx(auVar78,3);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(short)uVar7],3);
          uVar7 = vpextrw_avx(auVar78,4);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(short)uVar7],4);
          uVar7 = vpextrw_avx(auVar78,5);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(short)uVar7],5);
          uVar7 = vpextrw_avx(auVar78,6);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(short)uVar7],6);
          uVar7 = vpextrw_avx(auVar78,7);
          auVar88 = vpinsrw_avx(auVar88,(uint)left[(short)uVar7],7);
          auVar85._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar30;
          auVar85._16_16_ = ZEXT116(1) * auVar33;
          auVar93._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar88;
          auVar93._16_16_ = ZEXT116(1) * auVar53;
          auVar99._8_2_ = 0x1f;
          auVar99._0_8_ = 0x1f001f001f001f;
          auVar99._10_2_ = 0x1f;
          auVar99._12_2_ = 0x1f;
          auVar99._14_2_ = 0x1f;
          auVar99._16_2_ = 0x1f;
          auVar99._18_2_ = 0x1f;
          auVar99._20_2_ = 0x1f;
          auVar99._22_2_ = 0x1f;
          auVar99._24_2_ = 0x1f;
          auVar99._26_2_ = 0x1f;
          auVar99._28_2_ = 0x1f;
          auVar99._30_2_ = 0x1f;
          auVar75 = vpsrlw_avx2(auVar48,1);
          auVar75 = vpand_avx2(auVar75,auVar99);
          auVar48 = vpsubw_avx2(auVar93,auVar85);
          auVar48 = vpmullw_avx2(auVar48,auVar75);
          auVar75 = vpsllw_avx2(auVar85,5);
          auVar75 = vpaddw_avx2(auVar75,auVar32);
          auVar75 = vpaddw_avx2(auVar48,auVar75);
          auVar75 = vpsrlw_avx2(auVar75,5);
        }
        auVar48 = vpsubw_avx2(auVar47,auVar58);
        auVar48 = vpmullw_avx2(auVar48,auVar38);
        auVar92 = vpsllw_avx2(auVar58,5);
        auVar48 = vpaddw_avx2(auVar48,auVar92);
        auVar48 = vpaddw_avx2(auVar48,auVar32);
        auVar48 = vpsrlw_avx2(auVar48,5);
        auVar75 = vpblendvb_avx2(auVar48,auVar75,(undefined1  [32])HighbdBaseMask[uVar11]);
        *(undefined1 (*) [32])((long)local_70 + lVar8 * 2) = auVar75;
        iVar19 = iVar19 + 0x400;
      }
      local_70 = (undefined1 (*) [16])((long)local_70 + stride * 2);
      iVar6 = iVar6 - dx;
      iVar4 = iVar4 + 1;
    }
  }
  else {
    auVar27._4_4_ = dy;
    auVar27._0_4_ = dy;
    auVar27._8_4_ = dy;
    auVar27._12_4_ = dy;
    auVar29._16_4_ = dy;
    auVar29._0_16_ = auVar27;
    auVar29._20_4_ = dy;
    auVar29._24_4_ = dy;
    auVar29._28_4_ = dy;
    if (bh < 1) {
      bh = 0;
    }
    iVar6 = -dx;
    auVar56 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
    auVar35._8_4_ = 0xfffffffe;
    auVar35._0_8_ = 0xfffffffefffffffe;
    auVar35._12_4_ = 0xfffffffe;
    auVar35._16_4_ = 0xfffffffe;
    auVar35._20_4_ = 0xfffffffe;
    auVar35._24_4_ = 0xfffffffe;
    auVar35._28_4_ = 0xfffffffe;
    auVar36._8_4_ = 0x1f;
    auVar36._0_8_ = 0x1f0000001f;
    auVar36._12_4_ = 0x1f;
    auVar36._16_4_ = 0x1f;
    auVar36._20_4_ = 0x1f;
    auVar36._24_4_ = 0x1f;
    auVar36._28_4_ = 0x1f;
    auVar39._8_4_ = 0x10;
    auVar39._0_8_ = 0x1000000010;
    auVar39._12_4_ = 0x10;
    auVar39._16_4_ = 0x10;
    auVar39._20_4_ = 0x10;
    auVar39._24_4_ = 0x10;
    auVar39._28_4_ = 0x10;
    auVar71 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
    iVar4 = 0;
    while (iVar4 != bh) {
      uVar20 = (uint)-((iVar4 + 1) * dx) >> 1;
      uVar11 = uVar20 & 0x1f;
      auVar52._0_8_ = CONCAT44(uVar20,uVar20) & 0x1f0000001f;
      auVar52._8_4_ = uVar11;
      auVar52._12_4_ = uVar11;
      auVar52._16_4_ = uVar11;
      auVar52._20_4_ = uVar11;
      auVar52._24_4_ = uVar11;
      auVar52._28_4_ = uVar11;
      iVar19 = iVar4 << 6;
      auVar65._4_4_ = iVar19;
      auVar65._0_4_ = iVar19;
      auVar65._8_4_ = iVar19;
      auVar65._12_4_ = iVar19;
      auVar65._16_4_ = iVar19;
      auVar65._20_4_ = iVar19;
      auVar65._24_4_ = iVar19;
      auVar65._28_4_ = iVar19;
      iVar19 = iVar6;
      for (lVar8 = 0; lVar8 < bw; lVar8 = lVar8 + 0x10) {
        uVar11 = iVar19 >> 6;
        uVar20 = -(uVar11 + 2);
        if (-3 < (int)uVar11) {
          uVar20 = 0;
        }
        uVar9 = 0xffffffff;
        if ((int)uVar11 < -1) {
          uVar9 = uVar11;
        }
        uVar9 = ~uVar9;
        if ((int)uVar11 < -0x11) {
          uVar9 = 0x10;
        }
        auVar33 = (undefined1  [16])0x0;
        auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if ((int)uVar20 < 8) {
          uVar17 = (ulong)uVar20;
          auVar30 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar11 + uVar17),
                                (undefined1  [16])HighbdLoadMaskx[uVar17]);
          auVar53 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar11 + uVar17 + 1),
                                (undefined1  [16])HighbdLoadMaskx[uVar17]);
          auVar44 = vpmovzxwd_avx2(auVar30);
          auVar75 = vpmovzxwd_avx2(auVar53);
          auVar75 = vpsubd_avx2(auVar75,auVar44);
          auVar44 = vpslld_avx2(auVar44,5);
          auVar75 = vpmulld_avx2(auVar75,auVar52);
          auVar44 = vpaddd_avx2(auVar44,auVar39);
          auVar44 = vpaddd_avx2(auVar75,auVar44);
          auVar44 = vpsrld_avx2(auVar44,5);
          auVar94._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar44._16_16_;
          auVar94._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar27;
          auVar44 = vpackusdw_avx2(auVar44,auVar94);
        }
        uVar20 = -(uVar11 + 10);
        if (-0xb < (int)uVar11) {
          uVar20 = 0;
        }
        if ((int)uVar20 < 8) {
          uVar17 = (ulong)uVar20;
          auVar33 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar11 + uVar17 + 8),
                                (undefined1  [16])HighbdLoadMaskx[uVar17]);
          auVar30 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar11 + uVar17 + 9),
                                (undefined1  [16])HighbdLoadMaskx[uVar17]);
          auVar75 = vpmovzxwd_avx2(auVar33);
          auVar48 = vpmovzxwd_avx2(auVar30);
          auVar48 = vpsubd_avx2(auVar48,auVar75);
          auVar75 = vpslld_avx2(auVar75,5);
          auVar48 = vpmulld_avx2(auVar48,auVar52);
          auVar75 = vpaddd_avx2(auVar75,auVar39);
          auVar75 = vpaddd_avx2(auVar48,auVar75);
          auVar75 = vpsrld_avx2(auVar75,5);
          auVar95._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar75._16_16_;
          auVar95._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar27;
          auVar75 = vpackusdw_avx2(auVar75,auVar95);
          auVar33 = auVar75._0_16_;
        }
        auVar75 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if ((int)uVar11 < -1) {
          uVar7 = (undefined4)lVar8;
          auVar96._4_4_ = uVar7;
          auVar96._0_4_ = uVar7;
          auVar96._8_4_ = uVar7;
          auVar96._12_4_ = uVar7;
          auVar96._16_4_ = uVar7;
          auVar96._20_4_ = uVar7;
          auVar96._24_4_ = uVar7;
          auVar96._28_4_ = uVar7;
          auVar75 = vpor_avx2(auVar96,auVar56);
          auVar75 = vpmulld_avx2(auVar75,auVar29);
          auVar50 = vpsubd_avx2(auVar65,auVar75);
          auVar48 = vpsrad_avx2(auVar50,6);
          auVar75 = vpcmpgtd_avx2(auVar48,auVar35);
          auVar48 = vpand_avx2(auVar75,auVar48);
          auVar75 = vpaddd_avx2(auVar96,auVar71);
          auVar75 = vpmulld_avx2(auVar75,auVar29);
          auVar64 = vpsubd_avx2(auVar65,auVar75);
          auVar92 = vpsrad_avx2(auVar64,6);
          auVar75 = vpcmpgtd_avx2(auVar92,auVar35);
          auVar92 = vpand_avx2(auVar75,auVar92);
          auVar30 = vpinsrw_avx(ZEXT216(left[auVar48._0_4_]),(uint)left[auVar48._4_4_],1);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar48._8_4_],2);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar48._12_4_],3);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar48._16_4_],4);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar48._20_4_],5);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar48._24_4_],6);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar48._28_4_],7);
          auVar53 = vpinsrw_avx(ZEXT216(left[(long)auVar48._0_4_ + 1]),
                                (uint)left[(long)auVar48._4_4_ + 1],1);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar48._8_4_ + 1],2);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar48._12_4_ + 1],3);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar48._16_4_ + 1],4);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar48._20_4_ + 1],5);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar48._24_4_ + 1],6);
          auVar51 = vpmovzxwd_avx2(auVar30);
          auVar30 = vpinsrw_avx(auVar53,(uint)left[(long)auVar48._28_4_ + 1],7);
          auVar48 = vpmovzxwd_avx2(auVar30);
          auVar75 = vpsrld_avx2(auVar50,1);
          auVar75 = vpand_avx2(auVar75,auVar36);
          auVar48 = vpsubd_avx2(auVar48,auVar51);
          auVar48 = vpmulld_avx2(auVar48,auVar75);
          auVar75 = vpslld_avx2(auVar51,5);
          auVar75 = vpaddd_avx2(auVar75,auVar39);
          auVar75 = vpaddd_avx2(auVar48,auVar75);
          auVar30 = vpinsrw_avx(ZEXT216(left[auVar92._0_4_]),(uint)left[auVar92._4_4_],1);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._8_4_],2);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._12_4_],3);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._16_4_],4);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._20_4_],5);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._24_4_],6);
          auVar30 = vpinsrw_avx(auVar30,(uint)left[auVar92._28_4_],7);
          auVar53 = vpinsrw_avx(ZEXT216(left[(long)auVar92._0_4_ + 1]),
                                (uint)left[(long)auVar92._4_4_ + 1],1);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._8_4_ + 1],2);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._12_4_ + 1],3);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._16_4_ + 1],4);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._20_4_ + 1],5);
          auVar53 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._24_4_ + 1],6);
          auVar51 = vpmovzxwd_avx2(auVar30);
          auVar30 = vpinsrw_avx(auVar53,(uint)left[(long)auVar92._28_4_ + 1],7);
          auVar92 = vpmovzxwd_avx2(auVar30);
          auVar48 = vpsrld_avx2(auVar64,1);
          auVar48 = vpand_avx2(auVar48,auVar36);
          auVar92 = vpsubd_avx2(auVar92,auVar51);
          auVar92 = vpmulld_avx2(auVar92,auVar48);
          auVar48 = vpslld_avx2(auVar51,5);
          auVar48 = vpaddd_avx2(auVar48,auVar39);
          auVar48 = vpaddd_avx2(auVar92,auVar48);
          auVar92 = vperm2i128_avx2(auVar75,auVar48,0x31);
          auVar92 = vpsrld_avx2(auVar92,5);
          auVar97._0_16_ = ZEXT116(0) * auVar48._0_16_ + ZEXT116(1) * auVar75._0_16_;
          auVar97._16_16_ = ZEXT116(0) * auVar75._16_16_ + ZEXT116(1) * auVar48._0_16_;
          auVar75 = vpsrld_avx2(auVar97,5);
          auVar75 = vpackusdw_avx2(auVar75,auVar92);
        }
        auVar77._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar44._0_16_;
        auVar77._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar33;
        auVar44 = vpblendvb_avx2(auVar77,auVar75,(undefined1  [32])HighbdBaseMask[uVar9]);
        *(undefined1 (*) [32])((long)local_70 + lVar8 * 2) = auVar44;
        iVar19 = iVar19 + 0x400;
      }
      local_70 = (undefined1 (*) [16])((long)local_70 + stride * 2);
      iVar6 = iVar6 - dx;
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z2_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_above,
                                      int upsample_left, int dx, int dy,
                                      int bd) {
  (void)bd;
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      if (bd < 12) {
        highbd_dr_prediction_z2_Nx4_avx2(bh, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_Nx4_avx2(bh, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
    case 8:
      if (bd < 12) {
        highbd_dr_prediction_z2_Nx8_avx2(bh, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_Nx8_avx2(bh, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
    default:
      if (bd < 12) {
        highbd_dr_prediction_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
  }
}